

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

Map * Map_Push_And_Get(Map *tree,void *str,size_t size,void *id)

{
  Map *tree_00;
  void *local_38;
  size_t temp;
  void *id_local;
  size_t size_local;
  void *str_local;
  Map *tree_local;
  
  temp = (size_t)id;
  id_local = (void *)size;
  size_local = (size_t)str;
  str_local = tree;
  Map_Scour(tree,str,size,(size_t *)&local_38,(Map **)&str_local);
  if (local_38 == id_local) {
    if (*(long *)((long)str_local + 0x808) != 0) {
      *(size_t *)((long)str_local + 0x808) = temp;
    }
    *(undefined1 *)str_local = 1;
    tree_local = (Map *)str_local;
  }
  else {
    for (; local_38 < id_local; local_38 = (void *)((long)local_38 + 1)) {
      tree_00 = (Map *)malloc(0x810);
      *(Map **)((long)str_local + (ulong)*(byte *)(size_local + (long)local_38) * 8 + 8) = tree_00;
      str_local = tree_00;
      Map_Init(tree_00);
    }
    *(size_t *)((long)str_local + 0x808) = temp;
    *(undefined1 *)str_local = 1;
    tree_local = (Map *)str_local;
  }
  return tree_local;
}

Assistant:

struct Map* Map_Push_And_Get(struct Map* tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		if(tree->ID!=NULL)tree->ID=id;
		tree->is_final=1;
		return tree;
	}

	for(temp;temp<size;++temp)
	{
		Map_Init(
			tree=
			tree->delta[((unsigned char*)str)[temp]]=
			malloc(sizeof(Map))
			);
	}

	tree->ID=id;
	tree->is_final=1;
	return tree;
}